

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.cpp
# Opt level: O1

void __thiscall Actions::emplace(Actions *this,ActionType type,int target_id,Vec2 pos)

{
  iterator __position;
  Action act;
  Action local_10;
  
  __position._M_current = *(Action **)&this->field_0x8;
  if (__position._M_current == *(Action **)&this->field_0x10) {
    local_10.actionType = type;
    local_10.target_id = target_id;
    local_10.pos = pos;
    std::vector<Action,std::allocator<Action>>::_M_realloc_insert<Action_const&>
              ((vector<Action,std::allocator<Action>> *)this,__position,&local_10);
  }
  else {
    (__position._M_current)->actionType = type;
    (__position._M_current)->target_id = target_id;
    (__position._M_current)->pos = pos;
    *(long *)&this->field_0x8 = *(long *)&this->field_0x8 + 0x10;
  }
  return;
}

Assistant:

void Actions::emplace(ActionType type, int target_id, Vec2 pos)
{
    Action act(type);
    act.target_id = target_id;
    act.pos = pos;
    actions.push_back(act);
}